

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlcxx2_html.hpp
# Opt level: O2

bool __thiscall htmlcxx2::HTML::Node::attribute(Node *this,string *key,string *value)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar3 = (long)(this->attributeKeys_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->attributeKeys_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  lVar4 = 0;
  uVar2 = 0;
  do {
    if (uVar3 == uVar2) {
LAB_00156aa7:
      return uVar2 < uVar3;
    }
    iVar1 = impl::icompare<char>
                      (*(char **)((long)&(((this->attributeKeys_).
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar4),(key->_M_dataplus)._M_p);
    if (iVar1 == 0) {
      std::__cxx11::string::_M_assign((string *)value);
      goto LAB_00156aa7;
    }
    uVar2 = uVar2 + 1;
    lVar4 = lVar4 + 0x20;
  } while( true );
}

Assistant:

inline bool Node::attribute(const std::string &key, std::string &value) const
{
    for (size_t i = 0, l = attributeKeys_.size(); i < l; ++i)
    {
        if (impl::icompare(attributeKeys_[i].c_str(), key.c_str()) == 0)
        {
            value = attributeValues_[i];
            return true;
        }
    }
    return false;
}